

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

QStringList * __thiscall
MakefileGenerator::escapeFilePaths
          (QStringList *__return_storage_ptr__,MakefileGenerator *this,QStringList *paths)

{
  ulong uVar1;
  long lVar2;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((paths->d).size != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                (&local_50,this,(long)&(((paths->d).ptr)->d).d + lVar2);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_50);
      QList<QString>::end(__return_storage_ptr__);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x18;
    } while (uVar1 < (ulong)(paths->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList
MakefileGenerator::escapeFilePaths(const QStringList &paths) const
{
    QStringList ret;
    for(int i = 0; i < paths.size(); ++i)
        ret.append(escapeFilePath(paths.at(i)));
    return ret;
}